

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O2

bool __thiscall Nibbler::getUnsignedInt(Nibbler *this,int *result)

{
  ulong uVar1;
  ulong uVar2;
  intmax_t iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char *local_48 [4];
  
  uVar1 = this->_cursor;
  uVar2 = this->_length;
  uVar4 = uVar1;
  uVar5 = uVar2;
  if (uVar2 < uVar1) {
    uVar5 = uVar1;
  }
  while ((uVar6 = uVar5, uVar4 < uVar2 &&
         (uVar6 = uVar4, (int)(this->_input)._M_dataplus._M_p[uVar4] - 0x30U < 10))) {
    uVar4 = uVar4 + 1;
  }
  if (uVar1 < uVar6) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)this);
    iVar3 = strtoimax(local_48[0],(char **)0x0,10);
    *result = (int)iVar3;
    std::__cxx11::string::~string((string *)local_48);
    this->_cursor = uVar6;
  }
  return uVar1 < uVar6;
}

Assistant:

bool Nibbler::getUnsignedInt (int& result)
{
  std::string::size_type i = _cursor;
  // TODO Potential for use of find_first_not_of
  while (i < _length && isdigit (_input[i]))
    ++i;

  if (i > _cursor)
  {
    result = strtoimax (_input.substr (_cursor, i - _cursor).c_str (), NULL, 10);
    _cursor = i;
    return true;
  }

  return false;
}